

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_asn1.cc
# Opt level: O0

ECDSA_SIG * ECDSA_SIG_parse(CBS *cbs)

{
  int iVar1;
  size_t sVar2;
  undefined1 local_30 [8];
  CBS child;
  ECDSA_SIG *ret;
  CBS *cbs_local;
  
  child.len = (size_t)ECDSA_SIG_new();
  if ((ECDSA_SIG *)child.len != (ECDSA_SIG *)0x0) {
    iVar1 = CBS_get_asn1(cbs,(CBS *)local_30,0x20000010);
    if ((((iVar1 != 0) &&
         (iVar1 = BN_parse_asn1_unsigned((CBS *)local_30,*(BIGNUM **)child.len), iVar1 != 0)) &&
        (iVar1 = BN_parse_asn1_unsigned((CBS *)local_30,*(BIGNUM **)(child.len + 8)), iVar1 != 0))
       && (sVar2 = CBS_len((CBS *)local_30), sVar2 == 0)) {
      return (ECDSA_SIG *)child.len;
    }
    ERR_put_error(0x1a,0,100,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_asn1.cc"
                  ,0xf9);
    ECDSA_SIG_free((ECDSA_SIG *)child.len);
  }
  return (ECDSA_SIG *)0x0;
}

Assistant:

ECDSA_SIG *ECDSA_SIG_parse(CBS *cbs) {
  ECDSA_SIG *ret = ECDSA_SIG_new();
  if (ret == NULL) {
    return NULL;
  }
  CBS child;
  if (!CBS_get_asn1(cbs, &child, CBS_ASN1_SEQUENCE) ||
      !BN_parse_asn1_unsigned(&child, ret->r) ||
      !BN_parse_asn1_unsigned(&child, ret->s) || CBS_len(&child) != 0) {
    OPENSSL_PUT_ERROR(ECDSA, ECDSA_R_BAD_SIGNATURE);
    ECDSA_SIG_free(ret);
    return NULL;
  }
  return ret;
}